

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O0

bool doesReverseUpdateWorks<CyclicHash<unsigned_int,unsigned_char>>(uint L)

{
  CyclicHash<unsigned_int,_unsigned_char> *this;
  uint32_conflict uVar1;
  uint uVar2;
  reference pvVar3;
  uchar local_1833;
  uchar local_1832;
  value_type local_1831;
  uint local_1830;
  char c_1;
  uchar out;
  uint32_conflict k_1;
  uchar local_181d;
  uint local_181c;
  undefined1 local_1818 [3];
  uchar c;
  uint32_conflict k;
  deque<unsigned_char,_std::allocator<unsigned_char>_> s;
  CyclicHash<unsigned_int,_unsigned_char> hf;
  uint n;
  mersenneRNG generator;
  uint L_local;
  
  mersenneRNG::mersenneRNG((mersenneRNG *)&hf.maskn,5);
  hf.myr = 3;
  CyclicHash<unsigned_int,_unsigned_char>::CyclicHash
            ((CyclicHash<unsigned_int,_unsigned_char> *)
             ((long)&s.super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_node + 4),3,L);
  std::deque<unsigned_char,_std::allocator<unsigned_char>_>::deque
            ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1818);
  for (local_181c = 0; local_181c < 3; local_181c = local_181c + 1) {
    uVar1 = mersenneRNG::operator()((mersenneRNG *)&hf.maskn);
    local_181d = (char)uVar1 + 'A';
    std::deque<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1818,&local_181d);
    CyclicHash<unsigned_int,_unsigned_char>::eat
              ((CyclicHash<unsigned_int,_unsigned_char> *)
               ((long)&s.super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Deque_impl_data._M_finish._M_node + 4),local_181d);
  }
  local_1830 = 0;
  do {
    if (99999 < local_1830) {
      generator._5015_1_ = 1;
LAB_001056ce:
      std::deque<unsigned_char,_std::allocator<unsigned_char>_>::~deque
                ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1818);
      return (bool)generator._5015_1_;
    }
    pvVar3 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::front
                       ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1818);
    local_1831 = *pvVar3;
    std::deque<unsigned_char,_std::allocator<unsigned_char>_>::pop_front
              ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1818);
    uVar1 = mersenneRNG::operator()((mersenneRNG *)&hf.maskn);
    local_1833 = (char)uVar1 + 'A';
    local_1832 = local_1833;
    std::deque<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1818,&local_1833);
    this = (CyclicHash<unsigned_int,_unsigned_char> *)
           ((long)&s.super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_node + 4);
    CyclicHash<unsigned_int,_unsigned_char>::update(this,local_1831,local_1832);
    CyclicHash<unsigned_int,_unsigned_char>::reverse_update(this,local_1831,local_1832);
    CyclicHash<unsigned_int,_unsigned_char>::update
              ((CyclicHash<unsigned_int,_unsigned_char> *)
               ((long)&s.super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Deque_impl_data._M_finish._M_node + 4),local_1831,local_1832);
    uVar2 = CyclicHash<unsigned_int,unsigned_char>::
            hash<std::deque<unsigned_char,std::allocator<unsigned_char>>>
                      ((CyclicHash<unsigned_int,unsigned_char> *)
                       ((long)&s.super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Deque_impl_data._M_finish._M_node + 4),
                       (deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1818);
    if (uVar2 != s.super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_node._4_4_) {
      generator._5015_1_ = 0;
      goto LAB_001056ce;
    }
    local_1830 = local_1830 + 1;
  } while( true );
}

Assistant:

bool doesReverseUpdateWorks(uint L = 7) {
  mersenneRNG generator(5);
  const uint n(3); // n-grams
  hashfunction hf(n, L);
  deque<unsigned char> s;
  for (uint32 k = 0; k < n; ++k) {
    unsigned char c = static_cast<unsigned char>(generator() + 65);
    s.push_back(c);
    hf.eat(c);
  }
  for (uint32 k = 0; k < 100000; ++k) {
    unsigned char out = s.front();
    s.pop_front();
    char c(generator() + 65);
    s.push_back(c);
    hf.update(out, c);
    hf.reverse_update(out, c);
    hf.update(out, c);
    if (hf.hash(s) != hf.hashvalue) {
      return false;
    }
  }
  return true;
}